

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxLocalVariable::Emit(FxLocalVariable *this,VMFunctionBuilder *build)

{
  byte bVar1;
  int iVar2;
  FxLocalVariableDeclaration *pFVar3;
  PType *pPVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  undefined8 local_38;
  
  pFVar3 = this->Variable;
  if ((pFVar3->VarFlags & 0x800) == 0) {
    uVar7 = 0x10000000000;
    uVar8 = this->RegOffset + pFVar3->RegNum;
    uVar9 = (uint)((pFVar3->super_FxExpression).ValueType)->RegType;
    bVar10 = ((this->super_FxExpression).ValueType)->RegCount;
    uVar6 = (ulong)*(uint *)&this->AddressRequested << 0x38;
  }
  else {
    if (this->AddressRequested == false) {
      pPVar4 = (this->super_FxExpression).ValueType;
      bVar1 = pPVar4->RegType;
      uVar9 = (uint)bVar1;
      bVar10 = pPVar4->RegCount;
      uVar8 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar10);
      local_38 = (ulong)CONCAT14(((this->super_FxExpression).ValueType)->loadOp,uVar8) &
                 0xffffffff0000ffff;
      iVar2 = this->Variable->RegNum;
      uVar5 = VMFunctionBuilder::GetConstantInt(build,this->RegOffset);
      VMFunctionBuilder::Emit(build,local_38._4_4_,(int)local_38,iVar2,uVar5);
    }
    else {
      if (this->RegOffset == 0) {
        uVar7 = 0x10000000000;
        uVar8 = (uint)(ushort)pFVar3->RegNum;
        uVar9 = 3;
        bVar10 = 1;
        uVar6 = 0;
        goto LAB_0053284a;
      }
      uVar8 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
      iVar2 = this->Variable->RegNum;
      uVar5 = VMFunctionBuilder::GetConstantInt(build,this->RegOffset);
      VMFunctionBuilder::Emit(build,0xcd,uVar8 & 0xffff,iVar2,uVar5);
      uVar9 = 3;
      bVar10 = 1;
    }
    uVar6 = 0;
    uVar7 = 0;
  }
LAB_0053284a:
  return (ExpEmit)((ulong)(uVar8 & 0xffff) | (ulong)bVar10 << 0x18 | uVar6 | uVar7 |
                  (ulong)(uVar9 << 0x10));
}

Assistant:

ExpEmit FxLocalVariable::Emit(VMFunctionBuilder *build)
{
	// 'Out' variables are actually pointers but this fact must be hidden to the script.
	if (Variable->VarFlags & VARF_Out)
	{
		if (!AddressRequested)
		{
			ExpEmit reg(build, ValueType->GetRegType(), ValueType->GetRegCount());
			build->Emit(ValueType->GetLoadOp(), reg.RegNum, Variable->RegNum, build->GetConstantInt(RegOffset));
			return reg;
		}
		else
		{
			if (RegOffset == 0) return ExpEmit(Variable->RegNum, REGT_POINTER, false, true);
			ExpEmit reg(build, REGT_POINTER);
			build->Emit(OP_ADDA_RK, reg.RegNum, Variable->RegNum, build->GetConstantInt(RegOffset));
			return reg;
		}
	}
	else
	{
		ExpEmit ret(Variable->RegNum + RegOffset, Variable->ValueType->GetRegType(), false, true);
		ret.RegCount = ValueType->GetRegCount();
		if (AddressRequested) ret.Target = true;
		return ret;
	}
}